

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
cfd::core::WallyUtil::CreateScriptDataFromBytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes,int32_t flags)

{
  uint32_t flags_00;
  size_type sVar1;
  uchar *puVar2;
  uchar *bytes_out;
  undefined8 uVar3;
  string *in_stack_ffffffffffffff10;
  size_type in_stack_ffffffffffffff18;
  CfdError error_code;
  undefined4 in_stack_ffffffffffffff20;
  uint32_t in_stack_ffffffffffffff24;
  allocator local_89;
  string local_88 [32];
  CfdSourceLocation local_68;
  int local_4c;
  ulong uStack_48;
  int ret;
  size_t written;
  undefined1 local_29;
  size_t local_28;
  size_t write_max_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_18;
  int32_t flags_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *ret_bytes;
  
  write_max_size._4_4_ = flags;
  pvStack_18 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)bytes;
  bytes_local = __return_storage_ptr__;
  sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)bytes);
  local_28 = sVar1 + 5;
  local_29 = 0;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x3f99a7);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18
             ,(allocator_type *)in_stack_ffffffffffffff10);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x3f99cc);
  uStack_48 = 0;
  puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(pvStack_18);
  sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvStack_18);
  flags_00 = write_max_size._4_4_;
  bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3f9a09);
  local_4c = wally_script_push_from_bytes
                       (puVar2,sVar1,flags_00,bytes_out,local_28,&stack0xffffffffffffffb8);
  if ((local_4c == 0) && (local_28 < uStack_48)) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff10 =
         (string *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(pvStack_18);
    in_stack_ffffffffffffff18 =
         ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvStack_18);
    in_stack_ffffffffffffff24 = write_max_size._4_4_;
    puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3f9a9d);
    sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       __return_storage_ptr__);
    local_4c = wally_script_push_from_bytes
                         ((uchar *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
                          in_stack_ffffffffffffff24,puVar2,sVar1,&stack0xffffffffffffffb8);
  }
  if (local_4c == 0) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
    return __return_storage_ptr__;
  }
  local_68.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_wally_util.cpp"
               ,0x2f);
  error_code = (CfdError)(in_stack_ffffffffffffff18 >> 0x20);
  local_68.filename = local_68.filename + 1;
  local_68.line = 0x95;
  local_68.funcname = "CreateScriptDataFromBytes";
  logger::warn<>(&local_68,"Script push error.");
  uVar3 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_88,"Script push error.",&local_89);
  CfdException::CfdException
            ((CfdException *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             error_code,in_stack_ffffffffffffff10);
  __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::vector<uint8_t> WallyUtil::CreateScriptDataFromBytes(
    const std::vector<uint8_t>& bytes, int32_t flags) {
  size_t write_max_size = bytes.size() + kMaxVarIntSize;
  std::vector<uint8_t> ret_bytes(write_max_size);
  size_t written = 0;

  int ret = wally_script_push_from_bytes(
      bytes.data(), bytes.size(), flags, ret_bytes.data(), write_max_size,
      &written);
  if (ret == WALLY_OK && write_max_size < written) {
    // サイズ不足の場合はresizeしてリトライ
    ret_bytes.resize(written);
    ret = wally_script_push_from_bytes(
        bytes.data(), bytes.size(), flags, ret_bytes.data(), ret_bytes.size(),
        &written);
  }

  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "Script push error.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Script push error.");
  }
  ret_bytes.resize(written);
  return ret_bytes;
}